

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
               *this,raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                     *that)

{
  allocator_type *in_stack_000000a0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_stack_000000a8;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_stack_000000b0;
  allocator<cs_impl::any> *in_stack_ffffffffffffffb8;
  
  alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
             *)0x2401c7);
  allocator_traits<std::allocator<cs_impl::any>_>::select_on_container_copy_construction
            (in_stack_ffffffffffffffb8);
  raw_hash_set(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x2401f9);
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that)
				: raw_hash_set(that, AllocTraits::select_on_container_copy_construction(
				                   that.alloc_ref())) {}